

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O2

QPolygonF * QStyleHelper::calcLines(QPolygonF *__return_storage_ptr__,QStyleOptionSlider *dial)

{
  double *pdVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  pointer pQVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long in_FS_OFFSET;
  int iVar15;
  int iVar20;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  QArrayDataPointer<QPointF> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QPointF *)0x0;
  uVar2 = (dial->super_QStyleOptionComplex).super_QStyleOption.rect.x2;
  uVar4 = (dial->super_QStyleOptionComplex).super_QStyleOption.rect.y2;
  uVar3 = (dial->super_QStyleOptionComplex).super_QStyleOption.rect.x1;
  uVar5 = (dial->super_QStyleOptionComplex).super_QStyleOption.rect.y1;
  iVar15 = (uVar2 - uVar3) + 1;
  iVar20 = (uVar4 - uVar5) + 1;
  iVar6 = iVar20;
  if (iVar15 < iVar20) {
    iVar6 = iVar15;
  }
  iVar12 = iVar6 / 2;
  iVar11 = iVar6 / 0xc;
  if (iVar6 / 0xc < 5) {
    iVar11 = 4;
  }
  if (iVar6 / 4 <= iVar11) {
    iVar11 = iVar6 / 4;
  }
  iVar6 = dial->tickInterval;
  if (iVar6 != 0) {
    uVar7 = dial->minimum;
    iVar8 = dial->maximum;
    iVar9 = (int)(~uVar7 + iVar8 + iVar6) / iVar6;
    if (0 < iVar9) {
      dVar22 = (double)iVar12;
      if (1000 < (int)(iVar8 - uVar7) || iVar8 < (int)uVar7) {
        iVar9 = (iVar6 + 999) / iVar6;
      }
      dVar16 = (double)(iVar15 / 2) + 0.5;
      dVar21 = (double)(iVar20 / 2) + 0.5;
      QList<QPointF>::resize((QList<QPointF> *)&local_58,(long)(iVar9 * 2 + 2));
      dVar26 = (double)(iVar12 + -1);
      dVar27 = dVar26 - (double)(iVar11 / 2);
      dVar28 = (double)(iVar12 - iVar11);
      iVar15 = 0;
      iVar20 = 0;
      iVar11 = 0;
      lVar14 = 0;
      for (lVar13 = 0; lVar13 <= iVar9; lVar13 = lVar13 + 1) {
        if (dial->dialWrapping == true) {
          dVar17 = ((double)iVar15 * -3.141592653589793) / (double)iVar9 + 4.71238898038469;
        }
        else {
          dVar17 = (((double)iVar20 * -3.141592653589793) / (double)iVar9 + 25.132741228718345) /
                   6.0;
        }
        dVar18 = sin(dVar17);
        dVar19 = cos(dVar17);
        dVar17 = dVar28;
        dVar25 = -dVar28;
        dVar23 = dVar22;
        dVar24 = -dVar22;
        if (lVar14 != 0) {
          if (iVar11 % (int)(dial->pageStep + (uint)(dial->pageStep == 0)) != 0) {
            dVar17 = dVar27;
            dVar25 = -dVar27;
            dVar23 = dVar26;
            dVar24 = -dVar26;
          }
        }
        pQVar10 = QList<QPointF>::data((QList<QPointF> *)&local_58);
        pdVar1 = (double *)((long)&pQVar10->xp + lVar14);
        *pdVar1 = dVar17 * dVar19 + dVar16;
        pdVar1[1] = dVar25 * dVar18 + dVar21;
        pQVar10 = QList<QPointF>::data((QList<QPointF> *)&local_58);
        pdVar1 = (double *)((long)&pQVar10[1].xp + lVar14);
        *pdVar1 = dVar19 * dVar23 + dVar16;
        pdVar1[1] = dVar18 * dVar24 + dVar21;
        lVar14 = lVar14 + 0x20;
        iVar11 = iVar11 + iVar6;
        iVar20 = iVar20 + 10;
        iVar15 = iVar15 + 2;
      }
      QPolygonF::translated((QPointF *)__return_storage_ptr__);
      goto LAB_0033b19a;
    }
  }
  (__return_storage_ptr__->super_QList<QPointF>).d.d = (Data *)0x0;
  local_58.ptr = (QPointF *)0x0;
  (__return_storage_ptr__->super_QList<QPointF>).d.ptr = (QPointF *)0x0;
  local_58.size = 0;
  (__return_storage_ptr__->super_QList<QPointF>).d.size = 0;
LAB_0033b19a:
  QArrayDataPointer<QPointF>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF calcLines(const QStyleOptionSlider *dial)
{
    QPolygonF poly;
    int width = dial->rect.width();
    int height = dial->rect.height();
    qreal r = qMin(width, height) / 2;
    int bigLineSize = calcBigLineSize(int(r));

    qreal xc = width / 2 + 0.5;
    qreal yc = height / 2 + 0.5;
    const int ns = dial->tickInterval;
    if (!ns) // Invalid values may be set by Qt Widgets Designer.
        return poly;
    int notches = (dial->maximum + ns - 1 - dial->minimum) / ns;
    if (notches <= 0)
        return poly;
    if (dial->maximum < dial->minimum || dial->maximum - dial->minimum > 1000) {
        int maximum = dial->minimum + 1000;
        notches = (maximum + ns - 1 - dial->minimum) / ns;
    }

    poly.resize(2 + 2 * notches);
    int smallLineSize = bigLineSize / 2;
    for (int i = 0; i <= notches; ++i) {
        qreal angle = dial->dialWrapping ? Q_PI * 3 / 2 - i * 2 * Q_PI / notches
                  : (Q_PI * 8 - i * 10 * Q_PI / notches) / 6;
        qreal s = qSin(angle);
        qreal c = qCos(angle);
        if (i == 0 || (((ns * i) % (dial->pageStep ? dial->pageStep : 1)) == 0)) {
            poly[2 * i] = QPointF(xc + (r - bigLineSize) * c,
                                  yc - (r - bigLineSize) * s);
            poly[2 * i + 1] = QPointF(xc + r * c, yc - r * s);
        } else {
            poly[2 * i] = QPointF(xc + (r - 1 - smallLineSize) * c,
                                  yc - (r - 1 - smallLineSize) * s);
            poly[2 * i + 1] = QPointF(xc + (r - 1) * c, yc -(r - 1) * s);
        }
    }
    return poly.translated(dial->rect.topLeft());
}